

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  istream *this;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  string *psVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  bool local_4c5;
  int num_games;
  int local_4c0;
  int local_4bc;
  ulong local_4b8;
  undefined8 local_4b0;
  char **local_4a8;
  string ab;
  string dir;
  int tot1;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [31];
  stringstream sss;
  
  num_games = -1;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < argc) {
    uVar6 = (ulong)(uint)argc;
  }
  local_4c5 = true;
  local_4b8 = 0;
  local_4b0 = 0;
  local_4c0 = argc;
  local_4a8 = argv;
  do {
    if (uVar6 == uVar7) {
      init((EVP_PKEY_CTX *)(ulong)((byte)local_4b0 & 1));
      if ((local_4b8 & 1) == 0) {
        calc_adj();
        while (((byte)_ITM_registerTMCloneTable[*(long *)(std::cin + -0x18)] & 5) == 0) {
          local_428[0]._M_local_buf[0] = '\0';
          _ss = (pointer)local_428;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&ss);
          do_command((string *)&ss,false);
          std::__cxx11::string::~string((string *)&ss);
        }
      }
      else {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&ab,&bag);
        iVar9 = 0;
        iVar11 = 0;
        for (uVar10 = 0; (int)uVar10 < num_games; uVar10 = uVar10 + 1) {
          iVar3 = play_program(local_4c5,local_4bc);
          clear();
          std::vector<char,_std::allocator<char>_>::operator=
                    (&bag,(vector<char,_std::allocator<char>_> *)&ab);
          _ss = (pointer)(ulong)(seed % 0x7fffffff + (uint)(seed % 0x7fffffff == 0));
          seed = seed + 1;
          std::
          shuffle<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                     bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                     bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&ss);
          my_rack_size = 0;
          rack_size = 0;
          iVar11 = iVar11 + (uint)(iVar3 == 1);
          if ((uVar10 / 10) * 10 + iVar9 == 0) {
            std::ifstream::ifstream((istream *)&ss,"record.txt",_S_in);
            dir._M_dataplus._M_p = dir._M_dataplus._M_p & 0xffffffff00000000;
            tot1 = 0;
            this = (istream *)std::istream::operator>>((istream *)&ss,(int *)&dir);
            std::istream::operator>>(this,&tot1);
            std::ifstream::close();
            std::ofstream::ofstream((ostream *)&sss,"record.txt",_S_trunc);
            poVar5 = (ostream *)
                     std::ostream::operator<<((ostream *)&sss,iVar11 + (int)dir._M_dataplus._M_p);
            poVar5 = std::operator<<(poVar5," ");
            std::ostream::operator<<((ostream *)poVar5,tot1 + 10);
            std::ofstream::close();
            std::ofstream::~ofstream((ostream *)&sss);
            std::ifstream::~ifstream((istream *)&ss);
            iVar11 = 0;
          }
          local_4c5 = (bool)(local_4c5 ^ 1);
          iVar9 = iVar9 + -1;
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&ab);
      }
      return 0;
    }
    pcVar2 = local_4a8[uVar7];
    if (*pcVar2 == '-') {
      std::__cxx11::string::string((string *)&sss,pcVar2 + 3,(allocator *)&ab);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&sss,_S_out|_S_in);
      std::__cxx11::string::~string((string *)&sss);
      std::__cxx11::stringstream::stringstream((stringstream *)&sss);
      ab._M_dataplus._M_p = (pointer)&ab.field_2;
      ab._M_string_length = 0;
      ab.field_2._M_local_buf[0] = '\0';
      cVar1 = pcVar2[1];
      if (cVar1 == 'b') {
        psVar8 = &board_file_abi_cxx11_;
LAB_0010ba80:
        std::operator>>((istream *)&ss,(string *)psVar8);
      }
      else if (cVar1 == 'c') {
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        dir._M_string_length = 0;
        dir.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&ss,(string *)&dir);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tot1,
                       &dir,"/board.txt");
        std::__cxx11::string::operator=((string *)&board_file_abi_cxx11_,(string *)&tot1);
        std::__cxx11::string::~string((string *)&tot1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tot1,
                       &dir,"/tiles.txt");
        std::__cxx11::string::operator=((string *)&tile_file_abi_cxx11_,(string *)&tot1);
        std::__cxx11::string::~string((string *)&tot1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tot1,
                       &dir,"/dict.txt");
        std::__cxx11::string::operator=((string *)&dict_file_abi_cxx11_,(string *)&tot1);
        std::__cxx11::string::~string((string *)&tot1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tot1,
                       &dir,"/dict.bin");
        std::__cxx11::string::operator=((string *)&dict_bin_abi_cxx11_,(string *)&tot1);
        std::__cxx11::string::~string((string *)&tot1);
        std::__cxx11::string::~string((string *)&dir);
      }
      else {
        if (cVar1 == 'd') {
          psVar8 = &dict_file_abi_cxx11_;
          goto LAB_0010ba80;
        }
        if (cVar1 == 'p') {
          uVar4 = std::istream::operator>>((istream *)&ss,&num_games);
          local_4bc = *local_4a8[3] + -0x30;
          local_4c5 = (bool)(local_4c5 & local_4c0 != 5);
          local_4b8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        }
        else if (cVar1 == 'r') {
          local_4b0 = 1;
        }
        else {
          psVar8 = &tile_file_abi_cxx11_;
          if (cVar1 == 't') goto LAB_0010ba80;
        }
      }
      std::__cxx11::string::~string((string *)&ab);
      std::__cxx11::stringstream::~stringstream((stringstream *)&sss);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    bool rebuild = false;
    bool playing_self = false;
    bool go_first = true;
    int num_games = -1, verbosity;
    for (int i = 0; i < argc; i++) {
        char *s = argv[i];
        if (s[0] != '-') continue;
        stringstream ss(s + 3);
        stringstream sss;
        string ab;
        switch (s[1]) {
            case 'b':
                ss >> board_file;
                break;
            case 't':
                ss >> tile_file;
                break;
            case 'd':
                ss >> dict_file;
                break;
            case 'r':
                rebuild = true;
                break;
            case 'p':
                playing_self = true;
                ss >> num_games;
                verbosity = argv[3][0] - '0';
                //ab=string(argv[3]);
                //sss=stringstream{ab};
                //sss>>seed;
                if (argc == 5) go_first = false;
                break;
            case 'c':
                string dir;
                ss >> dir;
                board_file = dir + "/board.txt";
                tile_file = dir + "/tiles.txt";
                dict_file = dir + "/dict.txt";
                dict_bin = dir + "/dict.bin";
                break;
        }
    }
    init(rebuild);
    if (playing_self) {
        int wins = 0;
        const vector<char> baggy = bag;
        for (int i = 0; i < num_games; i++) {
            int res = play_program(go_first, verbosity);
            clear();
            bag = baggy;
            shuffle(bag.begin(), bag.end(), default_random_engine(seed++));
            rack_size = my_rack_size = 0;
            go_first = !go_first;
            wins += (res == 1);
            if (i % 10 == 0) {
                ifstream record("record.txt");
                int win1 = 0, tot1 = 0;
                record >> win1 >> tot1;
                record.close();
                ofstream recor("record.txt", ios::trunc);
                recor << win1 + wins << " " << tot1 + 10;
                recor.close();
                wins = 0;
            }
        }
        return 0;
    }
    calc_adj();
    while (cin) {
        string s;
        getline(cin, s);
        do_command(s, false);
    }
}